

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O1

void send_cb_recverr(uv_udp_send_t *req,int status)

{
  int iVar1;
  code **ppcVar2;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_20 [2];
  undefined8 local_10;
  ulong local_8;
  
  if (req == (uv_udp_send_t *)0x0) {
    apcStack_20[0] = (code *)0x1e2249;
    send_cb_recverr_cold_3();
  }
  else {
    if ((status != -0x6f) && (status != 0)) goto LAB_001e2258;
    local_8 = (ulong)(req->handle == &client2 || req->handle == &client);
    local_10 = 0;
    if (local_8 != 0) {
      send_cb_called = send_cb_called + 1;
      return;
    }
  }
  apcStack_20[0] = (code *)0x1e2258;
  send_cb_recverr_cold_1();
LAB_001e2258:
  apcStack_20[0] = close_cb;
  send_cb_recverr_cold_2();
  apcStack_20[0] = (code *)0x1;
  iVar1 = uv_is_closing();
  if (apcStack_20[0] == (code *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  ppcVar2 = apcStack_20;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(ppcVar2,0);
  return;
}

Assistant:

static void send_cb_recverr(uv_udp_send_t* req, int status) {
  ASSERT_PTR_NE(req, NULL);
  ASSERT(status == 0 || status == UV_ECONNREFUSED);
  CHECK_HANDLE(req->handle);
  send_cb_called++;
}